

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean save_marker(j_decompress_ptr cinfo)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long *in_RDI;
  jpeg_saved_marker_ptr_conflict prev;
  uint limit;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  JLONG length;
  JOCTET *data;
  uint data_length;
  uint bytes_read;
  jpeg_saved_marker_ptr_conflict cur_marker;
  my_marker_ptr_conflict marker;
  long *local_60;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  jpeg_memory_mgr *pjVar5;
  jpeg_error_mgr *pjVar6;
  jpeg_error_mgr *data_00;
  j_decompress_ptr cinfo_00;
  ulong local_38;
  JOCTET *local_30;
  uint local_28;
  uint local_24;
  undefined8 *local_20;
  
  lVar2 = in_RDI[0x49];
  local_20 = *(undefined8 **)(lVar2 + 0xf8);
  local_38 = 0;
  cinfo_00 = (j_decompress_ptr)in_RDI[5];
  data_00 = cinfo_00->err;
  pjVar5 = cinfo_00->mem;
  if (local_20 == (undefined8 *)0x0) {
    if (pjVar5 == (jpeg_memory_mgr *)0x0) {
      iVar3 = (*(code *)cinfo_00->client_data)(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      data_00 = cinfo_00->err;
      pjVar5 = cinfo_00->mem;
    }
    pjVar5 = (jpeg_memory_mgr *)((long)&pjVar5[-1].max_alloc_chunk + 7);
    pjVar6 = (jpeg_error_mgr *)((long)&data_00->error_exit + 1);
    bVar1 = *(byte *)&data_00->error_exit;
    if (pjVar5 == (jpeg_memory_mgr *)0x0) {
      iVar3 = (*(code *)cinfo_00->client_data)(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      pjVar6 = cinfo_00->err;
      pjVar5 = cinfo_00->mem;
    }
    pjVar5 = (jpeg_memory_mgr *)((long)&pjVar5[-1].max_alloc_chunk + 7);
    data_00 = (jpeg_error_mgr *)((long)&pjVar6->error_exit + 1);
    local_38 = ((ulong)*(byte *)&pjVar6->error_exit + (ulong)bVar1 * 0x100) - 2;
    if ((long)local_38 < 0) {
      local_28 = 0;
      local_30 = (JOCTET *)0x0;
    }
    else {
      if (*(int *)((long)in_RDI + 0x21c) == 0xfe) {
        in_stack_ffffffffffffffac = *(uint *)(lVar2 + 0xb0);
      }
      else {
        in_stack_ffffffffffffffac =
             *(uint *)(lVar2 + 0xb4 + (long)(*(int *)((long)in_RDI + 0x21c) + -0xe0) * 4);
      }
      uVar4 = (uint)local_38;
      if (uVar4 < in_stack_ffffffffffffffac) {
        in_stack_ffffffffffffffac = uVar4;
      }
      local_20 = (undefined8 *)
                 (**(code **)(in_RDI[1] + 8))(in_RDI,1,(ulong)in_stack_ffffffffffffffac + 0x20);
      *local_20 = 0;
      *(char *)(local_20 + 1) = (char)*(undefined4 *)((long)in_RDI + 0x21c);
      *(uint *)((long)local_20 + 0xc) = uVar4;
      *(uint *)(local_20 + 2) = in_stack_ffffffffffffffac;
      local_30 = (JOCTET *)(local_20 + 4);
      local_20[3] = local_30;
      *(undefined8 **)(lVar2 + 0xf8) = local_20;
      *(undefined4 *)(lVar2 + 0x100) = 0;
      local_28 = in_stack_ffffffffffffffac;
    }
    local_24 = 0;
  }
  else {
    local_24 = *(uint *)(lVar2 + 0x100);
    local_28 = *(uint *)(local_20 + 2);
    local_30 = (JOCTET *)(local_20[3] + (ulong)local_24);
  }
  do {
    if (local_28 <= local_24) {
      if (local_20 != (undefined8 *)0x0) {
        if (in_RDI[0x32] == 0) {
          in_RDI[0x32] = (long)local_20;
        }
        else {
          for (local_60 = (long *)in_RDI[0x32]; *local_60 != 0; local_60 = (long *)*local_60) {
          }
          *local_60 = (long)local_20;
        }
        local_38 = (ulong)(*(int *)((long)local_20 + 0xc) - local_28);
      }
      *(undefined8 *)(lVar2 + 0xf8) = 0;
      uVar4 = (uint)((ulong)pjVar5 >> 0x20);
      if (*(int *)((long)in_RDI + 0x21c) == 0xe0) {
        examine_app0(cinfo_00,(JOCTET *)data_00,uVar4,
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      else if (*(int *)((long)in_RDI + 0x21c) == 0xee) {
        examine_app14(cinfo_00,(JOCTET *)data_00,uVar4,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x5b;
        *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x21c);
        *(uint *)(*in_RDI + 0x30) = local_28 + (int)local_38;
        (**(code **)(*in_RDI + 8))(in_RDI,1);
      }
      cinfo_00->err = data_00;
      cinfo_00->mem = pjVar5;
      if (0 < (long)local_38) {
        (**(code **)(in_RDI[5] + 0x20))(in_RDI,local_38);
      }
      return 1;
    }
    cinfo_00->err = data_00;
    cinfo_00->mem = pjVar5;
    *(uint *)(lVar2 + 0x100) = local_24;
    if (pjVar5 == (jpeg_memory_mgr *)0x0) {
      iVar3 = (*(code *)cinfo_00->client_data)(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      data_00 = cinfo_00->err;
      pjVar5 = cinfo_00->mem;
    }
    for (; local_24 < local_28 && pjVar5 != (jpeg_memory_mgr *)0x0; local_24 = local_24 + 1) {
      *local_30 = *(JOCTET *)&data_00->error_exit;
      pjVar5 = (jpeg_memory_mgr *)((long)&pjVar5[-1].max_alloc_chunk + 7);
      data_00 = (jpeg_error_mgr *)((long)&data_00->error_exit + 1);
      local_30 = local_30 + 1;
    }
  } while( true );
}

Assistant:

METHODDEF(boolean)
save_marker(j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET *data;
  JLONG length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {          /* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int)M_COM)
        limit = marker->length_limit_COM;
      else
        limit = marker->length_limit_APPn[cinfo->unread_marker - (int)M_APP0];
      if ((unsigned int)length < limit)
        limit = (unsigned int)length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
        (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                    sizeof(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8)cinfo->unread_marker;
      cur_marker->original_length = (unsigned int)length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET *)(cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);          /* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {     /* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
        prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
             (int)(data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);            /* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}